

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O0

void intgemm::kernel_write_test<(intgemm::CPUType)3,signed_char>(void)

{
  StringRef capturedExpression;
  char *pcVar1;
  char *__last;
  longlong (*palVar2) [4];
  size_t __n;
  AssertionHandler catchAssertionHandler;
  size_t i;
  AlignedVector<signed_char> output;
  AlignedVector<signed_char> input;
  ITransientExpression *expr;
  size_t in_stack_fffffffffffffe28;
  AssertionHandler *this;
  size_t in_stack_fffffffffffffe30;
  StringRef *macroName;
  AlignedVector<signed_char> *in_stack_fffffffffffffe38;
  AssertionHandler *this_00;
  char *in_stack_fffffffffffffe40;
  ExprLhs<const_signed_char_&> in_stack_fffffffffffffe48;
  SourceLineInfo *this_01;
  ITransientExpression *this_02;
  SourceLineInfo local_f0;
  StringRef local_e0;
  ulong local_88;
  ITransientExpression *local_80;
  AssertionHandler *pAStack_78;
  StringRef *pSStack_70;
  AssertionHandler *pAStack_68;
  AlignedVector<signed_char> local_50;
  AlignedVector<signed_char> local_40 [3];
  
  if (2 < kCPU) {
    AlignedVector<signed_char>::AlignedVector
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    AlignedVector<signed_char>::AlignedVector
              (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    pcVar1 = AlignedVector<signed_char>::begin(local_40);
    __last = AlignedVector<signed_char>::end(local_40);
    std::iota<signed_char*,signed_char>(pcVar1,__last,'\0');
    palVar2 = AlignedVector<signed_char>::as<long_long__vector(4)>(local_40);
    expr = (ITransientExpression *)(*palVar2)[0];
    this = (AssertionHandler *)(*palVar2)[1];
    macroName = (StringRef *)(*palVar2)[2];
    this_00 = (AssertionHandler *)(*palVar2)[3];
    pcVar1 = AlignedVector<signed_char>::begin(&local_50);
    this_02 = expr;
    local_80 = expr;
    pAStack_78 = this;
    pSStack_70 = macroName;
    pAStack_68 = this_00;
    kernels::write((int)pcVar1,(void *)0x0,__n);
    for (local_88 = 0; local_88 < 0x20; local_88 = local_88 + 1) {
      local_e0 = operator____catch_sr((char *)this,(size_t)expr);
      this_01 = &local_f0;
      Catch::SourceLineInfo::SourceLineInfo
                (this_01,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
                 ,0x1c);
      Catch::StringRef::StringRef((StringRef *)this_00,(char *)macroName);
      capturedExpression.m_size = (size_type)in_stack_fffffffffffffe48.m_lhs;
      capturedExpression.m_start = in_stack_fffffffffffffe40;
      Catch::AssertionHandler::AssertionHandler
                (this_00,macroName,(SourceLineInfo *)this,capturedExpression,
                 (Flags)((ulong)expr >> 0x20));
      AlignedVector<signed_char>::operator[](&local_50,local_88);
      in_stack_fffffffffffffe48 = Catch::Decomposer::operator<=((Decomposer *)expr,(char *)0x28be77)
      ;
      Catch::ExprLhs<signed_char_const&>::operator==
                ((ExprLhs<const_signed_char_&> *)this_02,(char *)this_01);
      Catch::AssertionHandler::handleExpr(this,expr);
      Catch::BinaryExpr<const_signed_char_&,_const_signed_char_&>::~BinaryExpr
                ((BinaryExpr<const_signed_char_&,_const_signed_char_&> *)0x28bedc);
      Catch::AssertionHandler::complete(this);
      Catch::AssertionHandler::~AssertionHandler(this);
    }
    AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x28bff7);
    AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x28c004);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}